

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

void progress_meter(Curl_easy *data)

{
  FILE *whereto;
  long lVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  long local_120;
  long local_110;
  curl_off_t local_108;
  long local_f8;
  curl_off_t timespent;
  curl_off_t total_estimate;
  curl_off_t dlestimate;
  curl_off_t ulestimate;
  char time_spent [10];
  char time_total [10];
  char time_left [10];
  curl_off_t total_expected_transfer;
  curl_off_t total_transfer;
  curl_off_t total_percen;
  curl_off_t ulpercen;
  curl_off_t dlpercen;
  char max5 [6] [10];
  Curl_easy *data_local;
  
  ulpercen = 0;
  total_percen = 0;
  total_transfer = 0;
  dlestimate = 0;
  total_estimate = 0;
  lVar1 = (data->progress).timespent / 1000000;
  unique0x1000079a = data;
  if (((data->progress).flags & 0x80U) == 0) {
    if ((data->state).resume_from != 0) {
      curl_mfprintf((data->set).err,"** Resuming transfer from byte position %ld\n",
                    (data->state).resume_from);
    }
    curl_mfprintf((stack0xffffffffffffffc8->set).err,
                  "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                 );
    (stack0xffffffffffffffc8->progress).flags = (stack0xffffffffffffffc8->progress).flags | 0x80;
  }
  if ((((stack0xffffffffffffffc8->progress).flags & 0x20U) != 0) &&
     (0 < (stack0xffffffffffffffc8->progress).ulspeed)) {
    dlestimate = (stack0xffffffffffffffc8->progress).size_ul /
                 (stack0xffffffffffffffc8->progress).ulspeed;
    if ((stack0xffffffffffffffc8->progress).size_ul < 0x2711) {
      if (0 < (stack0xffffffffffffffc8->progress).size_ul) {
        total_percen = ((stack0xffffffffffffffc8->progress).uploaded * 100) /
                       (stack0xffffffffffffffc8->progress).size_ul;
      }
    }
    else {
      total_percen = (stack0xffffffffffffffc8->progress).uploaded /
                     ((stack0xffffffffffffffc8->progress).size_ul / 100);
    }
  }
  if ((((stack0xffffffffffffffc8->progress).flags & 0x40U) != 0) &&
     (0 < (stack0xffffffffffffffc8->progress).dlspeed)) {
    total_estimate =
         (stack0xffffffffffffffc8->progress).size_dl / (stack0xffffffffffffffc8->progress).dlspeed;
    if ((stack0xffffffffffffffc8->progress).size_dl < 0x2711) {
      if (0 < (stack0xffffffffffffffc8->progress).size_dl) {
        ulpercen = ((stack0xffffffffffffffc8->progress).downloaded * 100) /
                   (stack0xffffffffffffffc8->progress).size_dl;
      }
    }
    else {
      ulpercen = (stack0xffffffffffffffc8->progress).downloaded /
                 ((stack0xffffffffffffffc8->progress).size_dl / 100);
    }
  }
  if (total_estimate < dlestimate) {
    local_f8 = dlestimate;
  }
  else {
    local_f8 = total_estimate;
  }
  if (local_f8 < 1) {
    local_108 = 0;
  }
  else {
    local_108 = local_f8 - lVar1;
  }
  time2str(time_total + 2,local_108);
  time2str(time_spent + 2,local_f8);
  time2str((char *)((long)&ulestimate + 2),lVar1);
  if (((stack0xffffffffffffffc8->progress).flags & 0x20U) == 0) {
    local_110 = (stack0xffffffffffffffc8->progress).uploaded;
  }
  else {
    local_110 = (stack0xffffffffffffffc8->progress).size_ul;
  }
  if (((stack0xffffffffffffffc8->progress).flags & 0x40U) == 0) {
    local_120 = (stack0xffffffffffffffc8->progress).downloaded;
  }
  else {
    local_120 = (stack0xffffffffffffffc8->progress).size_dl;
  }
  lVar1 = local_110 + local_120;
  lVar2 = (stack0xffffffffffffffc8->progress).downloaded +
          (stack0xffffffffffffffc8->progress).uploaded;
  if (lVar1 < 0x2711) {
    if (0 < lVar1) {
      total_transfer = (lVar2 * 100) / lVar1;
    }
  }
  else {
    total_transfer = lVar2 / (lVar1 / 100);
  }
  whereto = (stack0xffffffffffffffc8->set).err;
  pcVar3 = max5data(lVar1,max5[1] + 2);
  pcVar4 = max5data((stack0xffffffffffffffc8->progress).downloaded,(char *)&dlpercen);
  pcVar5 = max5data((stack0xffffffffffffffc8->progress).uploaded,max5[0] + 2);
  pcVar6 = max5data((stack0xffffffffffffffc8->progress).dlspeed,max5[2] + 2);
  pcVar7 = max5data((stack0xffffffffffffffc8->progress).ulspeed,max5[3] + 2);
  pcVar8 = max5data((stack0xffffffffffffffc8->progress).current_speed,max5[4] + 2);
  curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",total_transfer,pcVar3,
                ulpercen,pcVar4,total_percen,pcVar5,pcVar6,pcVar7,time_spent + 2,
                (long)&ulestimate + 2,time_total + 2,pcVar8);
  fflush((FILE *)(stack0xffffffffffffffc8->set).err);
  return;
}

Assistant:

static void progress_meter(struct Curl_easy *data)
{
  char max5[6][10];
  curl_off_t dlpercen = 0;
  curl_off_t ulpercen = 0;
  curl_off_t total_percen = 0;
  curl_off_t total_transfer;
  curl_off_t total_expected_transfer;
  char time_left[10];
  char time_total[10];
  char time_spent[10];
  curl_off_t ulestimate = 0;
  curl_off_t dlestimate = 0;
  curl_off_t total_estimate;
  curl_off_t timespent =
    (curl_off_t)data->progress.timespent/1000000; /* seconds */

  if(!(data->progress.flags & PGRS_HEADERS_OUT)) {
    if(data->state.resume_from) {
      fprintf(data->set.err,
              "** Resuming transfer from byte position %"
              CURL_FORMAT_CURL_OFF_T "\n", data->state.resume_from);
    }
    fprintf(data->set.err,
            "  %% Total    %% Received %% Xferd  Average Speed   "
            "Time    Time     Time  Current\n"
            "                                 Dload  Upload   "
            "Total   Spent    Left  Speed\n");
    data->progress.flags |= PGRS_HEADERS_OUT; /* headers are shown */
  }

  /* Figure out the estimated time of arrival for the upload */
  if((data->progress.flags & PGRS_UL_SIZE_KNOWN) &&
     (data->progress.ulspeed > CURL_OFF_T_C(0))) {
    ulestimate = data->progress.size_ul / data->progress.ulspeed;

    if(data->progress.size_ul > CURL_OFF_T_C(10000))
      ulpercen = data->progress.uploaded /
        (data->progress.size_ul/CURL_OFF_T_C(100));
    else if(data->progress.size_ul > CURL_OFF_T_C(0))
      ulpercen = (data->progress.uploaded*100) /
        data->progress.size_ul;
  }

  /* ... and the download */
  if((data->progress.flags & PGRS_DL_SIZE_KNOWN) &&
     (data->progress.dlspeed > CURL_OFF_T_C(0))) {
    dlestimate = data->progress.size_dl / data->progress.dlspeed;

    if(data->progress.size_dl > CURL_OFF_T_C(10000))
      dlpercen = data->progress.downloaded /
        (data->progress.size_dl/CURL_OFF_T_C(100));
    else if(data->progress.size_dl > CURL_OFF_T_C(0))
      dlpercen = (data->progress.downloaded*100) /
        data->progress.size_dl;
  }

  /* Now figure out which of them is slower and use that one for the
     total estimate! */
  total_estimate = ulestimate>dlestimate?ulestimate:dlestimate;

  /* create the three time strings */
  time2str(time_left, total_estimate > 0?(total_estimate - timespent):0);
  time2str(time_total, total_estimate);
  time2str(time_spent, timespent);

  /* Get the total amount of data expected to get transferred */
  total_expected_transfer =
    ((data->progress.flags & PGRS_UL_SIZE_KNOWN)?
     data->progress.size_ul:data->progress.uploaded)+
    ((data->progress.flags & PGRS_DL_SIZE_KNOWN)?
     data->progress.size_dl:data->progress.downloaded);

  /* We have transferred this much so far */
  total_transfer = data->progress.downloaded + data->progress.uploaded;

  /* Get the percentage of data transferred so far */
  if(total_expected_transfer > CURL_OFF_T_C(10000))
    total_percen = total_transfer /
      (total_expected_transfer/CURL_OFF_T_C(100));
  else if(total_expected_transfer > CURL_OFF_T_C(0))
    total_percen = (total_transfer*100) / total_expected_transfer;

  fprintf(data->set.err,
          "\r"
          "%3" CURL_FORMAT_CURL_OFF_T " %s  "
          "%3" CURL_FORMAT_CURL_OFF_T " %s  "
          "%3" CURL_FORMAT_CURL_OFF_T " %s  %s  %s %s %s %s %s",
          total_percen,  /* 3 letters */                /* total % */
          max5data(total_expected_transfer, max5[2]),   /* total size */
          dlpercen,      /* 3 letters */                /* rcvd % */
          max5data(data->progress.downloaded, max5[0]), /* rcvd size */
          ulpercen,      /* 3 letters */                /* xfer % */
          max5data(data->progress.uploaded, max5[1]),   /* xfer size */
          max5data(data->progress.dlspeed, max5[3]),    /* avrg dl speed */
          max5data(data->progress.ulspeed, max5[4]),    /* avrg ul speed */
          time_total,    /* 8 letters */                /* total time */
          time_spent,    /* 8 letters */                /* time spent */
          time_left,     /* 8 letters */                /* time left */
          max5data(data->progress.current_speed, max5[5])
    );

  /* we flush the output stream to make it appear as soon as possible */
  fflush(data->set.err);
}